

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::WriteTVaR
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,int epcalc,int eptype_tvar,
          map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
          *tail)

{
  bool bVar1;
  int strLen_00;
  reference ppVar2;
  reference pTVar3;
  TVaR t;
  __normal_iterator<TVaR_*,_std::vector<TVaR,_std::allocator<TVaR>_>_> local_1090;
  iterator __end2;
  iterator __begin2;
  vector<TVaR,_std::allocator<TVaR>_> *__range2;
  pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_> s;
  const_iterator __end1;
  const_iterator __begin1;
  map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  *__range1;
  char local_1038 [4];
  int strLen;
  char buffer [4096];
  int bufferSize;
  map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  *tail_local;
  int eptype_tvar_local;
  int epcalc_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  __end1 = std::
           map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
           ::begin(tail);
  s.second.super__Vector_base<TVaR,_std::allocator<TVaR>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                map<int,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                ::end(tail);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&s.second.
                                              super__Vector_base<TVaR,_std::allocator<TVaR>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>
             ::operator*(&__end1);
    std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>::pair
              ((pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_> *)&__range2,ppVar2);
    __end2 = std::vector<TVaR,_std::allocator<TVaR>_>::begin
                       ((vector<TVaR,_std::allocator<TVaR>_> *)&s);
    local_1090._M_current =
         (TVaR *)std::vector<TVaR,_std::allocator<TVaR>_>::end
                           ((vector<TVaR,_std::allocator<TVaR>_> *)&s);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&local_1090);
      if (!bVar1) break;
      pTVar3 = __gnu_cxx::__normal_iterator<TVaR_*,_std::vector<TVaR,_std::allocator<TVaR>_>_>::
               operator*(&__end2);
      local_1038[0] = '\0';
      t.retperiod._0_4_ = (float)*(undefined8 *)&pTVar3->tvar;
      strLen_00 = snprintf(local_1038,0x1000,"%d,%d,%d,%f,%f\n",SUB84(pTVar3->retperiod,0),
                           (double)t.retperiod._0_4_,(ulong)(uint)__range2,(ulong)(uint)epcalc,
                           (ulong)(uint)eptype_tvar);
      OutputRows(this,fileIDs,local_1038,strLen_00);
      __gnu_cxx::__normal_iterator<TVaR_*,_std::vector<TVaR,_std::allocator<TVaR>_>_>::operator++
                (&__end2);
    }
    std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>::~pair
              ((pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_> *)&__range2);
    std::_Rb_tree_const_iterator<std::pair<const_int,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void aggreports::WriteTVaR(const std::vector<int> &fileIDs, const int epcalc,
			   const int eptype_tvar,
			   const std::map<int, std::vector<TVaR>> &tail) {

  const int bufferSize = 4096;
  char buffer[bufferSize];
  int strLen;

  for (auto s : tail) {
    for (auto t : s.second) {
      buffer[0] = 0;
      strLen = snprintf(buffer, bufferSize, "%d,%d,%d,%f,%f\n", s.first,
			epcalc, eptype_tvar, t.retperiod, t.tvar);
      OutputRows(fileIDs, buffer, strLen);
    }
  }

}